

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

char * get_multiple_arg_token(char *arg)

{
  size_t sVar1;
  char *in_RDI;
  size_t j;
  size_t i;
  size_t num_of_escape;
  size_t len;
  char *ret;
  char *tok;
  ulong local_40;
  long local_38;
  long local_30;
  long local_28;
  char *local_18;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_18 = strchr(in_RDI,0x2c);
    local_30 = 0;
    while ((local_18 != (char *)0x0 && (local_18[-1] == '\\'))) {
      local_18 = strchr(local_18 + 1,0x2c);
      local_30 = local_30 + 1;
    }
    if (local_18 == (char *)0x0) {
      sVar1 = strlen(in_RDI);
    }
    else {
      sVar1 = (long)local_18 - (long)in_RDI;
    }
    local_28 = sVar1 + 1;
    sVar1 = local_28 - local_30;
    local_8 = (char *)malloc(sVar1);
    local_38 = 0;
    local_40 = 0;
    while (in_RDI[local_38] != '\0' && local_40 < sVar1 - 1) {
      if (((in_RDI[local_38] == '\\') && (in_RDI[local_38 + 1] != '\0')) &&
         (in_RDI[local_38 + 1] == ',')) {
        local_38 = local_38 + 1;
      }
      local_8[local_40] = in_RDI[local_38];
      local_40 = local_40 + 1;
      local_38 = local_38 + 1;
    }
    local_8[sVar1 - 1] = '\0';
  }
  return local_8;
}

Assistant:

static char *
get_multiple_arg_token(const char *arg)
{
  const char *tok;
  char *ret;
  size_t len, num_of_escape, i, j;

  if (!arg)
    return 0;

  tok = strchr (arg, ',');
  num_of_escape = 0;

  /* make sure it is not escaped */
  while (tok)
    {
      if (*(tok-1) == '\\')
        {
          /* find the next one */
          tok = strchr (tok+1, ',');
          ++num_of_escape;
        }
      else
        break;
    }

  if (tok)
    len = (size_t)(tok - arg + 1);
  else
    len = strlen (arg) + 1;

  len -= num_of_escape;

  ret = (char *) malloc (len);

  i = 0;
  j = 0;
  while (arg[i] && (j < len-1))
    {
      if (arg[i] == '\\' && 
	  arg[ i + 1 ] && 
	  arg[ i + 1 ] == ',')
        ++i;

      ret[j++] = arg[i++];
    }

  ret[len-1] = '\0';

  return ret;
}